

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaScript.c
# Opt level: O2

void Gia_ManPerformFlow3(int nLutSize,int nCutNum,int fBalance,int fMinAve,int fUseMfs,
                        int fUseLutLib,int fVerbose)

{
  char *pcVar1;
  char *pcVar2;
  int iVar3;
  Abc_Frame_t *pAVar4;
  Gia_Man_t *pGVar5;
  char *sCommand;
  char *pcVar6;
  char Comm2 [200];
  char Comm1 [200];
  char acStack_298 [208];
  char local_1c8 [208];
  char local_f8 [200];
  
  sCommand = acStack_298;
  pcVar6 = "&mfs; ";
  if (fUseMfs == 0) {
    pcVar6 = "";
  }
  if (fUseLutLib == 0) {
    sprintf(local_f8,"&st; &if -C %d -K %d; &save; &st; &syn2; &if -C %d -K %d; &save; &load",
            nCutNum,nLutSize,nCutNum,nLutSize);
    iVar3 = Abc_NtkRecIsRunning3();
    pcVar2 = "I4 4+vI Jv4 g4Jv 4Iv5 v4>I v4J5 v>J4 4QvI vI4+Q Z4Jv ZJg4 p4vI pvI>4 pvJ4 y";
    pcVar1 = "I4 4+vI Jv4 g4Jv 4Iv5 v4>I v4J5 v>J4 4QvI vI4+Q Z4Jv ZJg4 p4vI pvI>4 pvJ4 y";
    if (iVar3 == 0) {
      pcVar1 = "Wd#GL. G8Wd&L WdG#HL. G8Wg&L dM#GQ dM&GQ ZGdM# Z&GgM GQMdj# GQ8dM& dMjZG# g";
    }
    sprintf(local_1c8,"&st; &if -%s -K 6; &dch -f; &if -C %d -K %d; %s&save; &load",pcVar1 + 0x4a,
            nCutNum,nLutSize,pcVar6);
    iVar3 = Abc_NtkRecIsRunning3();
    if (iVar3 == 0) {
      pcVar2 = "Wd#GL. G8Wd&L WdG#HL. G8Wg&L dM#GQ dM&GQ ZGdM# Z&GgM GQMdj# GQ8dM& dMjZG# g";
    }
    sprintf(acStack_298,"&st; &if -%s -K 6; &synch2; &if -C %d -K %d; %s&save; &load",pcVar2 + 0x4a,
            nCutNum,nLutSize,pcVar6);
  }
  else {
    sprintf(local_f8,"&st; &if -C %d;       &save; &st; &syn2; &if -C %d;       &save; &load",
            nCutNum,nCutNum);
    iVar3 = Abc_NtkRecIsRunning3();
    pcVar2 = "I4 4+vI Jv4 g4Jv 4Iv5 v4>I v4J5 v>J4 4QvI vI4+Q Z4Jv ZJg4 p4vI pvI>4 pvJ4 y";
    pcVar1 = "I4 4+vI Jv4 g4Jv 4Iv5 v4>I v4J5 v>J4 4QvI vI4+Q Z4Jv ZJg4 p4vI pvI>4 pvJ4 y";
    if (iVar3 == 0) {
      pcVar1 = "Wd#GL. G8Wd&L WdG#HL. G8Wg&L dM#GQ dM&GQ ZGdM# Z&GgM GQMdj# GQ8dM& dMjZG# g";
    }
    sprintf(local_1c8,"&st; &if -%s -K 6; &dch -f; &if -C %d;       %s&save; &load",pcVar1 + 0x4a,
            nCutNum,pcVar6);
    iVar3 = Abc_NtkRecIsRunning3();
    if (iVar3 == 0) {
      pcVar2 = "Wd#GL. G8Wd&L WdG#HL. G8Wg&L dM#GQ dM&GQ ZGdM# Z&GgM GQMdj# GQ8dM& dMjZG# g";
    }
    sprintf(acStack_298,"&st; &if -%s -K 6; &synch2; &if -C %d;       %s&save; &load",pcVar2 + 0x4a,
            nCutNum,pcVar6);
  }
  if (fVerbose == 0) {
    pAVar4 = Abc_FrameGetGlobalFrame();
    pcVar6 = local_f8;
  }
  else {
    iVar3 = Abc_NtkRecIsRunning3();
    pcVar6 = "LMS";
    if (iVar3 == 0) {
      pcVar6 = "SOP balancing";
    }
    printf("Trying simple synthesis with %s...\n",pcVar6);
    pAVar4 = Abc_FrameGetGlobalFrame();
    Cmd_CommandExecute(pAVar4,local_f8);
    pAVar4 = Abc_FrameGetGlobalFrame();
    pcVar6 = "&ps";
  }
  Cmd_CommandExecute(pAVar4,pcVar6);
  pAVar4 = Abc_FrameGetGlobalFrame();
  pGVar5 = Abc_FrameReadGia(pAVar4);
  iVar3 = Gia_ManAndNum(pGVar5);
  if (iVar3 < 200000) {
    if (fVerbose == 0) {
      pcVar6 = local_1c8;
    }
    else {
      puts("Trying medium synthesis...");
      pAVar4 = Abc_FrameGetGlobalFrame();
      Cmd_CommandExecute(pAVar4,local_1c8);
      pcVar6 = "&ps";
    }
    pAVar4 = Abc_FrameGetGlobalFrame();
    Cmd_CommandExecute(pAVar4,pcVar6);
  }
  pAVar4 = Abc_FrameGetGlobalFrame();
  pGVar5 = Abc_FrameReadGia(pAVar4);
  iVar3 = Gia_ManAndNum(pGVar5);
  if (iVar3 < 10000) {
    if (fVerbose == 0) goto LAB_005f9309;
    puts("Trying harder synthesis...");
    pAVar4 = Abc_FrameGetGlobalFrame();
    Cmd_CommandExecute(pAVar4,acStack_298);
    pAVar4 = Abc_FrameGetGlobalFrame();
    Cmd_CommandExecute(pAVar4,"&ps");
  }
  else if (fVerbose == 0) {
    return;
  }
  puts("Final result...");
  sCommand = "&ps";
LAB_005f9309:
  pAVar4 = Abc_FrameGetGlobalFrame();
  Cmd_CommandExecute(pAVar4,sCommand);
  return;
}

Assistant:

void Gia_ManPerformFlow3( int nLutSize, int nCutNum, int fBalance, int fMinAve, int fUseMfs, int fUseLutLib, int fVerbose )
{
    char Comm1[200], Comm2[200], Comm3[200];
    if ( fUseLutLib )
        sprintf( Comm1, "&st; &if -C %d;       &save; &st; &syn2; &if -C %d;       &save; &load", nCutNum, nCutNum );
    else
        sprintf( Comm1, "&st; &if -C %d -K %d; &save; &st; &syn2; &if -C %d -K %d; &save; &load", nCutNum, nLutSize, nCutNum, nLutSize );
    if ( fUseLutLib )
        sprintf( Comm2, "&st; &if -%s -K 6; &dch -f; &if -C %d;       %s&save; &load", Abc_NtkRecIsRunning3() ? "y" : "g", nCutNum,           fUseMfs ? "&mfs; ":"" );
    else
        sprintf( Comm2, "&st; &if -%s -K 6; &dch -f; &if -C %d -K %d; %s&save; &load", Abc_NtkRecIsRunning3() ? "y" : "g", nCutNum, nLutSize, fUseMfs ? "&mfs; ":"" );
    if ( fUseLutLib )
        sprintf( Comm3, "&st; &if -%s -K 6; &synch2; &if -C %d;       %s&save; &load", Abc_NtkRecIsRunning3() ? "y" : "g", nCutNum,           fUseMfs ? "&mfs; ":"" );
    else
        sprintf( Comm3, "&st; &if -%s -K 6; &synch2; &if -C %d -K %d; %s&save; &load", Abc_NtkRecIsRunning3() ? "y" : "g", nCutNum, nLutSize, fUseMfs ? "&mfs; ":"" );

    if ( fVerbose ) printf( "Trying simple synthesis with %s...\n", Abc_NtkRecIsRunning3() ? "LMS" : "SOP balancing" );
    Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), Comm1 );
    if ( fVerbose )
    Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), "&ps" );

    if ( Gia_ManAndNum( Abc_FrameReadGia(Abc_FrameGetGlobalFrame()) ) < 200000 )
    {
        if ( fVerbose ) printf( "Trying medium synthesis...\n" );
        Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), Comm2 );
        if ( fVerbose )
        Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), "&ps" );
    }

    if ( Gia_ManAndNum( Abc_FrameReadGia(Abc_FrameGetGlobalFrame()) ) < 10000 )
    {
        if ( fVerbose ) printf( "Trying harder synthesis...\n" );
        Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), Comm3 );
        if ( fVerbose )
        Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), "&ps" );
    }

    if ( fVerbose ) printf( "Final result...\n" );
    if ( fVerbose )
    Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), "&ps" );
}